

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O1

void __thiscall
duckdb::CheckpointReader::ReadView
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  int iVar1;
  CreateViewInfo *info;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  CreateInfo *local_18;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"view");
  local_20._M_head_impl = (CreateInfo *)0x0;
  iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar1 != '\0') {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize((CreateInfo *)&stack0xffffffffffffffe8,deserializer);
    local_20._M_head_impl = local_18;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  info = (CreateViewInfo *)
         unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                   ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *
                    )&local_20);
  Catalog::CreateView(this->catalog,transaction,info);
  if (local_20._M_head_impl != (CreateInfo *)0x0) {
    (*((local_20._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return;
}

Assistant:

void CheckpointReader::ReadView(CatalogTransaction transaction, Deserializer &deserializer) {
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "view");
	auto &view_info = info->Cast<CreateViewInfo>();
	catalog.CreateView(transaction, view_info);
}